

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

bool __thiscall flexbuffers::Reference::MutateFloat(Reference *this,double d)

{
  byte bVar1;
  BitWidth BVar2;
  uint8_t *puVar3;
  double d_local;
  Reference *this_local;
  
  if (this->type_ == FBT_FLOAT) {
    puVar3 = this->data_;
    bVar1 = this->parent_width_;
    BVar2 = WidthF(d);
    this_local._7_1_ = MutateF<double>(this,puVar3,d,(ulong)bVar1,BVar2);
  }
  else if (this->type_ == FBT_INDIRECT_FLOAT) {
    puVar3 = Indirect(this);
    bVar1 = this->byte_width_;
    BVar2 = WidthF(d);
    this_local._7_1_ = MutateF<double>(this,puVar3,d,(ulong)bVar1,BVar2);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MutateFloat(double d) {
    if (type_ == FBT_FLOAT) {
      return MutateF(data_, d, parent_width_, WidthF(d));
    } else if (type_ == FBT_INDIRECT_FLOAT) {
      return MutateF(Indirect(), d, byte_width_, WidthF(d));
    } else {
      return false;
    }
  }